

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_unset_property(Integer g_a)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Integer g_a_00;
  logical lVar5;
  Integer *lo_00;
  C_Integer *pCVar6;
  long n;
  char *string;
  long in_RDI;
  cache_struct_t *next;
  void *buf;
  void *ptr;
  Integer ld [7];
  Integer hi [7];
  Integer lo [7];
  Integer chunk [7];
  Integer dims [7];
  Integer *list;
  Integer status;
  Integer mem_size;
  Integer nelem;
  Integer maplen;
  Integer handle;
  Integer dflt_grp;
  Integer origin_id;
  Integer nodeid;
  Integer nprocs;
  Integer grp_me;
  Integer g_tmp;
  Integer *in_stack_000001e0;
  int chk;
  int btot;
  int ndim;
  int d;
  int i;
  Integer ga_handle;
  Integer in_stack_00000360;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  long *in_stack_fffffffffffffe00;
  Integer in_stack_fffffffffffffe08;
  char **in_stack_fffffffffffffe10;
  char **in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  cache_struct *pcVar7;
  long local_1c8;
  int in_stack_fffffffffffffe44;
  long *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe54;
  C_Long in_stack_fffffffffffffe58;
  char **in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  long local_188;
  int in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  long local_148 [8];
  C_Integer aCStack_108 [8];
  C_Integer aCStack_c8 [9];
  long local_80;
  long local_78;
  long local_70;
  Integer in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  Integer *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  Integer *in_stack_ffffffffffffffc0;
  int local_20;
  int local_14;
  
  lVar4 = in_RDI + 1000;
  if (GA[lVar4].property == 1) {
    iVar2 = (int)GA[lVar4].ndim;
    for (local_14 = 0; local_14 < iVar2; local_14 = local_14 + 1) {
      aCStack_108[local_14] = GA[lVar4].chunk[local_14];
      aCStack_c8[local_14] = GA[lVar4].dims[local_14];
    }
    g_a_00 = pnga_create_handle();
    pnga_set_data((Integer)in_stack_fffffffffffffe20,(Integer)in_stack_fffffffffffffe18,
                  (Integer *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    iVar3 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    pnga_set_pgroup((Integer)in_stack_fffffffffffffe00,
                    CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    lVar5 = pnga_allocate(in_stack_00000360);
    if (lVar5 == 0) {
      pnga_error(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    lo_00 = (Integer *)pnga_pgroup_nodeid((long)GA[lVar4].old_handle);
    pnga_distribution(chunk[4],chunk[3],(Integer *)chunk[2],(Integer *)chunk[1]);
    bVar1 = true;
    for (local_14 = 0; local_14 < iVar2; local_14 = local_14 + 1) {
      (&local_1c8)[local_14] = ((&local_188)[local_14] - local_148[local_14]) + 1;
      if ((&local_188)[local_14] < local_148[local_14]) {
        bVar1 = false;
      }
    }
    if (bVar1) {
      pnga_access_ptr(g_a,(Integer *)ga_handle,_d,_btot,in_stack_000001e0);
      pnga_get(g_a_00,lo_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    }
    if (GA[lVar4].p_handle < 1) {
      in_stack_fffffffffffffe10 = GA[lVar4].ptr;
      pnga_pgroup_nodeid((long)GA[lVar4].p_handle);
      ARMCI_Free((void *)0x120ea8);
    }
    else {
      in_stack_fffffffffffffe18 = GA[lVar4].ptr;
      pnga_pgroup_nodeid((long)GA[lVar4].p_handle);
      ARMCI_Free_group(in_stack_fffffffffffffe00,
                       (ARMCI_Group *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8))
      ;
    }
    local_20 = 0;
    for (local_14 = 0; local_14 < iVar2; local_14 = local_14 + 1) {
      GA[lVar4].nblock[local_14] = GA[lVar4].old_nblock[local_14];
      GA[lVar4].lo[local_14] = (long)GA[lVar4].old_lo[local_14];
      GA[lVar4].chunk[local_14] = (long)GA[lVar4].old_chunk[local_14];
      local_20 = GA[lVar4].nblock[local_14] + local_20;
    }
    free(GA[lVar4].mapc);
    pCVar6 = (C_Integer *)malloc((long)(local_20 + 1) << 3);
    GA[lVar4].mapc = pCVar6;
    for (local_14 = 0; local_14 < local_20 + 1; local_14 = local_14 + 1) {
      GA[lVar4].mapc[local_14] = GA[lVar4].old_mapc[local_14];
    }
    free(GA[lVar4].old_mapc);
    pnga_distribution(chunk[4],chunk[3],(Integer *)chunk[2],(Integer *)chunk[1]);
    bVar1 = true;
    local_70 = 1;
    for (local_14 = 0; local_14 < iVar2; local_14 = local_14 + 1) {
      if (((&local_188)[local_14] - GA[lVar4].lo[local_14]) + 1 < 1) {
        bVar1 = false;
      }
      local_70 = (((&local_188)[local_14] - GA[lVar4].lo[local_14]) + 1) * local_70;
    }
    local_78 = local_70 * GA[lVar4].elemsize;
    if (!bVar1) {
      local_78 = 0;
    }
    if (GA_memory_limited != 0) {
      GA_total_memory = GA[lVar4].size + GA_total_memory;
    }
    GAstat.curmem = GAstat.curmem - GA[lVar4].size;
    if (GA_memory_limited == 0) {
      local_80 = 1;
    }
    else {
      GA_total_memory = GA_total_memory - local_78;
      local_80 = (long)(int)(uint)(-1 < GA_total_memory);
      n = (long)GA[lVar4].old_handle;
      pnga_type_f2c(0x3f2);
      pnga_pgroup_gop((Integer)in_stack_fffffffffffffe20,(Integer)in_stack_fffffffffffffe18,
                      in_stack_fffffffffffffe10,n,(char *)in_stack_fffffffffffffe00);
      iVar3 = (int)((ulong)n >> 0x20);
    }
    string = (char *)(long)GA[lVar4].p_handle;
    GA[lVar4].p_handle = GA[lVar4].old_handle;
    if (local_80 == 0) {
      GA[lVar4].ptr[(long)lo_00] = (char *)0x0;
    }
    else {
      if (GA[lVar4].mem_dev_set == 0) {
        iVar3 = gai_getmem(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                           (C_Long)in_stack_fffffffffffffe10,iVar3,in_stack_fffffffffffffe00,
                           in_stack_fffffffffffffdfc);
      }
      else {
        iVar3 = gai_get_devmem(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                               in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                               in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                               in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
      }
      local_80 = (long)(int)(uint)((iVar3 != 0 ^ 0xffU) & 1);
    }
    GA[lVar4].size = local_78;
    if (local_80 == 0) {
      pnga_error(string,in_stack_ffffffffffffff98);
    }
    pnga_pgroup_destroy((Integer)in_stack_fffffffffffffe10);
    GA[lVar4].property = 0;
    pnga_distribution(chunk[4],chunk[3],(Integer *)chunk[2],(Integer *)chunk[1]);
    bVar1 = true;
    local_70 = 1;
    for (local_14 = 0; local_14 < iVar2; local_14 = local_14 + 1) {
      (&local_1c8)[local_14] = ((&local_188)[local_14] - local_148[local_14]) + 1;
      local_70 = (&local_1c8)[local_14] * local_70;
      if ((&local_188)[local_14] < local_148[local_14]) {
        bVar1 = false;
      }
    }
    if (bVar1) {
      pnga_access_ptr(g_a,(Integer *)ga_handle,_d,_btot,in_stack_000001e0);
      pnga_get(g_a_00,lo_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    }
    pnga_destroy((Integer)in_stack_fffffffffffffe18);
  }
  else if (GA[lVar4].property == 2) {
    if (GA[lVar4].cache_head != (cache_struct_t *)0x0) {
      pcVar7 = (GA[lVar4].cache_head)->next;
      if ((GA[lVar4].cache_head)->cache_buf != (void *)0x0) {
        free((GA[lVar4].cache_head)->cache_buf);
      }
      free(GA[lVar4].cache_head);
      while (pcVar7 != (cache_struct *)0x0) {
        GA[lVar4].cache_head = pcVar7;
        pcVar7 = pcVar7->next;
        if ((GA[lVar4].cache_head)->cache_buf != (void *)0x0) {
          free((GA[lVar4].cache_head)->cache_buf);
        }
        free(GA[lVar4].cache_head);
      }
    }
    GA[lVar4].cache_head = (cache_struct_t *)0x0;
  }
  else {
    GA[lVar4].property = 0;
  }
  return;
}

Assistant:

void pnga_unset_property(Integer g_a) {
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].property == READ_ONLY) {
    /* TODO: Copy global array to original configuration */
    int i, d, ndim, btot, chk;
    Integer g_tmp, grp_me;
    Integer nprocs, nodeid, origin_id, dflt_grp, handle, maplen;
    Integer nelem, mem_size, status;
    Integer *list;
    Integer dims[MAXDIM], chunk[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM];
    void *ptr, *buf;

    ndim = (int)GA[ga_handle].ndim;
    /* Start by making a copy of the GA */
    for (i=0; i<ndim; i++) {
      chunk[i] = GA[ga_handle].chunk[i];
      dims[i] = GA[ga_handle].dims[i];
    }
    /* Make a temporary copy of GA */
    g_tmp = pnga_create_handle();
    pnga_set_data(g_tmp,ndim,GA[ga_handle].dims,GA[ga_handle].type);
    pnga_set_pgroup(g_tmp,GA[ga_handle].old_handle);
    if (!pnga_allocate(g_tmp)) {
      pnga_error("Failed to allocate temporary array",0);
    }
    /* Copy portion of global array to locally held portion of tmp array */
    grp_me = pnga_pgroup_nodeid(GA[ga_handle].old_handle);
    pnga_distribution(g_tmp,grp_me,lo,hi);
    chk = 1;
    for (i=0; i<ndim; i++) {
      ld[i] = hi[i]-lo[i]+1;
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
      pnga_access_ptr(g_tmp,lo,hi,&ptr,ld);
      pnga_get(g_a,lo,hi,ptr,ld);
    }

    /* Get rid of current memory allocation */
#ifndef AVOID_MA_STORAGE
    if(gai_uses_shm((int)GA[ga_handle].p_handle)){
#endif
      /* make sure that we free original (before address allignment)
       * pointer */
#ifdef MSG_COMMS_MPI
      if (GA[ga_handle].p_handle > 0){
        ARMCI_Free_group(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].p_handle)]
            - GA[ga_handle].id,
            &PGRP_LIST[GA[ga_handle].p_handle].group);
      }
      else
#endif
      {
        ARMCI_Free(
            GA[ga_handle].ptr[pnga_pgroup_nodeid(GA[ga_handle].p_handle)]
            - GA[ga_handle].id);
      }
#ifndef AVOID_MA_STORAGE
    }else{
      if(GA[ga_handle].id != INVALID_MA_HANDLE) MA_free_heap(GA[ga_handle].id);
    }
#endif
    
    /* Reset distribution parameters back to original values */
    btot = 0;
    for (i=0; i<ndim; i++) {
      GA[ga_handle].nblock[i] = GA[ga_handle].old_nblock[i];
      GA[ga_handle].lo[i] = GA[ga_handle].old_lo[i];
      GA[ga_handle].chunk[i] = GA[ga_handle].old_chunk[i];
      btot += GA[ga_handle].nblock[i];
    }
    free(GA[ga_handle].mapc);
    GA[ga_handle].mapc = (Integer*)malloc((btot+1)*sizeof(Integer));
    for (i=0; i<btot+1; i++) {
      GA[ga_handle].mapc[i] = GA[ga_handle].old_mapc[i];
    }
    free(GA[ga_handle].old_mapc);

    pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    chk = 1;
    for( i = 0, nelem=1; i< ndim; i++){
      if (hi[i]-(Integer)GA[ga_handle].lo[i]+1 <= 0) chk = 0;
      nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1);
    }
    mem_size = nelem * GA[ga_handle].elemsize;
    if (!chk) mem_size = 0;

    if(GA_memory_limited) GA_total_memory += GA[ga_handle].size;
    GAstat.curmem -= GA[ga_handle].size;
    /* if requested, enforce limits on memory consumption */
    if(GA_memory_limited) GA_total_memory -= mem_size;
    /* check if everybody has enough memory left */
    if(GA_memory_limited){
      status = (GA_total_memory >= 0) ? 1 : 0;
      pnga_pgroup_gop(GA[ga_handle].old_handle,pnga_type_f2c(MT_F_INT),
          &status, 1, "&&");
    } else status = 1;
    handle = (Integer)GA[ga_handle].p_handle;
    GA[ga_handle].p_handle = GA[ga_handle].old_handle;
    if (status) {
      /* Allocate new memory */
      if (GA[ga_handle].mem_dev_set) {
        status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, GA[ga_handle].p_handle,
            GA[ga_handle].mem_dev_set,GA[ga_handle].mem_dev);
      } else {
        status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
            GA[ga_handle].type, &GA[ga_handle].id, GA[ga_handle].p_handle);
      }
    } else {
      GA[ga_handle].ptr[grp_me]=NULL;
    }
    GA[ga_handle].size = (C_Long)mem_size;
    if (!status) {
      pnga_error("Memory failure when setting READ_ONLY",0);
    }
    /* Get rid of read-only group */
    pnga_pgroup_destroy(handle);
    /* Generate parameters for new memory allocation. Distribution function
     * should work, so we can use that to find out how much data is on this
     * processor */
    GA[ga_handle].property = NO_PROPERTY;
    pnga_distribution(g_a,GAme,lo,hi);
    chk = 1;
    nelem = 1;
    for (i=0; i<ndim; i++) {
      ld[i] = hi[i]-lo[i]+1;
      nelem *= ld[i];
      if (hi[i] < lo[i]) chk = 0;
    }
    if (chk) {
#if 1
      pnga_access_ptr(g_a,lo,hi,&ptr,ld);
      pnga_get(g_tmp,lo,hi,ptr,ld);
#else
      /* MPI RMA does not allow you to use memory assigned to one window as
       * local buffer for another buffer. Create a local buffer to get around
       * this problem */
      buf = (void*)malloc(nelem*GA[ga_handle].elemsize);
      pnga_get(g_tmp,lo,hi,buf,ld);
      pnga_access_ptr(g_a,lo,hi,&ptr,ld);
      memcpy(ptr,buf,nelem*GA[ga_handle].elemsize);
      free(buf);
#endif
    }
    pnga_destroy(g_tmp);
  } else if (GA[ga_handle].property == READ_CACHE) {
    if (GA[ga_handle].cache_head != NULL) {
      cache_struct_t *next;
      next = GA[ga_handle].cache_head->next;
      if (GA[ga_handle].cache_head->cache_buf)
        free(GA[ga_handle].cache_head->cache_buf);
      free(GA[ga_handle].cache_head);
      while (next) {
        GA[ga_handle].cache_head = next;
        next = next->next;
        if (GA[ga_handle].cache_head->cache_buf)
          free(GA[ga_handle].cache_head->cache_buf);
        free(GA[ga_handle].cache_head);
      }
    }
    GA[ga_handle].cache_head = NULL;
  } else {
    GA[ga_handle].property = NO_PROPERTY;
  }
}